

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O3

void __thiscall
pbrt::GaussianFilter::GaussianFilter
          (GaussianFilter *this,Vector2f *radius,Float sigma,Allocator alloc)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  float fVar5;
  float fVar6;
  int freq;
  int extraout_EDX;
  int extraout_EDX_00;
  float fVar7;
  FilterHandle local_20;
  
  freq = (int)alloc.memoryResource;
  (this->radius).super_Tuple2<pbrt::Vector2,_float> = radius->super_Tuple2<pbrt::Vector2,_float>;
  this->sigma = sigma;
  fVar1 = (radius->super_Tuple2<pbrt::Vector2,_float>).x;
  fVar7 = sigma * 6.2831855 * sigma;
  if (fVar7 < 0.0) {
    fVar6 = sqrtf(fVar7);
    freq = extraout_EDX;
  }
  else {
    auVar3 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar6 = auVar3._0_4_;
  }
  fVar5 = 0.0;
  fVar2 = (sigma + sigma) * sigma;
  fVar1 = ((fVar1 * fVar1) / fVar2) * -1.442695;
  auVar3 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  iVar4 = (int)auVar3._0_4_;
  if (-0x1f < iVar4) {
    if (iVar4 < 0x1f) {
      fVar1 = fVar1 - auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da1d5b6),0),ZEXT416((uint)fVar1),
                               ZEXT416(0x3e658299));
      auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar1),ZEXT416(0x3f3263b7));
      auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar1),ZEXT416(0x3f7ff3bf));
      fVar5 = (float)(iVar4 * 0x800000 + auVar3._0_4_);
    }
    else {
      fVar5 = INFINITY;
    }
  }
  this->expX = (1.0 / fVar6) * fVar5;
  fVar1 = (radius->super_Tuple2<pbrt::Vector2,_float>).y;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
    freq = extraout_EDX_00;
  }
  else {
    auVar3 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar3._0_4_;
  }
  fVar6 = 0.0;
  fVar1 = ((fVar1 * fVar1) / fVar2) * -1.442695;
  auVar3 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  iVar4 = (int)auVar3._0_4_;
  if (-0x1f < iVar4) {
    if (iVar4 < 0x1f) {
      fVar1 = fVar1 - auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da1d5b6),0),ZEXT416((uint)fVar1),
                               ZEXT416(0x3e658299));
      auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar1),ZEXT416(0x3f3263b7));
      auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)fVar1),ZEXT416(0x3f7ff3bf));
      fVar6 = (float)(iVar4 * 0x800000 + auVar3._0_4_);
    }
    else {
      fVar6 = INFINITY;
    }
  }
  this->expY = (1.0 / fVar7) * fVar6;
  local_20.
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
           )((ulong)this | 0x2000000000000);
  FilterSampler::FilterSampler(&this->sampler,&local_20,freq,alloc);
  return;
}

Assistant:

GaussianFilter(const Vector2f &radius, Float sigma = 0.5f, Allocator alloc = {})
        : radius(radius),
          sigma(sigma),
          expX(Gaussian(radius.x, 0, sigma)),
          expY(Gaussian(radius.y, 0, sigma)),
          sampler(this, 64, alloc) {}